

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
DeleteSubrange(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this,int start,int num)

{
  int in_EDX;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffef0;
  undefined4 local_e0;
  int in_stack_ffffffffffffff8c;
  RepeatedPtrFieldBase *in_stack_ffffffffffffff90;
  
  for (local_e0 = 0; local_e0 < in_EDX; local_e0 = local_e0 + 1) {
    internal::RepeatedPtrFieldBase::
    Delete<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  }
  ExtractSubrange(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
                  in_stack_fffffffffffffee0);
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::DeleteSubrange(int start, int num) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, size());
  for (int i = 0; i < num; ++i) {
    RepeatedPtrFieldBase::Delete<TypeHandler>(start + i);
  }
  ExtractSubrange(start, num, NULL);
}